

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc local_39;
  int local_38;
  char t;
  char p;
  int iStack_34;
  char c;
  int dummy;
  int maxv;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  y_local = x;
  if (x == (int *)0x0) {
    y_local = &local_38;
  }
  comp_local = y;
  if (y == (int *)0x0) {
    comp_local = &local_38;
  }
  _dummy = comp;
  if (comp == (int *)0x0) {
    _dummy = &local_38;
  }
  x_local = (int *)s;
  stbi__rewind(s);
  sVar1 = stbi__get8((stbi__context *)x_local);
  sVar2 = stbi__get8((stbi__context *)x_local);
  if ((sVar1 == 'P') && ((sVar2 == '5' || (sVar2 == '6')))) {
    iVar3 = 1;
    if (sVar2 == '6') {
      iVar3 = 3;
    }
    *_dummy = iVar3;
    local_39 = stbi__get8((stbi__context *)x_local);
    stbi__pnm_skip_whitespace((stbi__context *)x_local,(char *)&local_39);
    iVar3 = stbi__pnm_getinteger((stbi__context *)x_local,(char *)&local_39);
    *y_local = iVar3;
    stbi__pnm_skip_whitespace((stbi__context *)x_local,(char *)&local_39);
    iVar3 = stbi__pnm_getinteger((stbi__context *)x_local,(char *)&local_39);
    *comp_local = iVar3;
    stbi__pnm_skip_whitespace((stbi__context *)x_local,(char *)&local_39);
    iStack_34 = stbi__pnm_getinteger((stbi__context *)x_local,(char *)&local_39);
    if (iStack_34 < 0x100) {
      s_local._4_4_ = 1;
    }
    else {
      s_local._4_4_ = stbi__err("max value > 255");
    }
  }
  else {
    stbi__rewind((stbi__context *)x_local);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}